

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adaptive_quantize_sse2.c
# Opt level: O1

void aom_quantize_b_64x64_adaptive_sse2
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan)

{
  int *piVar1;
  tran_low_t *ptVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  char cVar7;
  bool bVar8;
  undefined1 auVar9 [14];
  undefined1 auVar10 [14];
  undefined1 auVar11 [14];
  undefined1 auVar12 [14];
  undefined1 auVar13 [14];
  undefined1 auVar14 [14];
  undefined1 auVar15 [14];
  undefined1 auVar16 [14];
  undefined1 auVar17 [14];
  undefined1 auVar18 [14];
  undefined1 auVar19 [14];
  undefined1 auVar20 [14];
  undefined1 auVar21 [14];
  undefined1 auVar22 [14];
  undefined1 auVar23 [14];
  undefined1 auVar24 [14];
  undefined1 auVar25 [14];
  undefined1 auVar26 [14];
  undefined1 auVar27 [14];
  undefined1 auVar28 [14];
  undefined1 auVar29 [14];
  bool bVar30;
  undefined1 auVar31 [14];
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  bool bVar42;
  bool bVar43;
  bool bVar44;
  undefined1 auVar45 [14];
  undefined1 auVar46 [14];
  undefined1 auVar47 [14];
  unkbyte10 Var48;
  undefined1 auVar49 [12];
  undefined1 auVar50 [14];
  undefined1 auVar51 [12];
  undefined1 auVar52 [14];
  undefined1 auVar53 [14];
  undefined1 auVar54 [14];
  undefined1 auVar55 [12];
  undefined1 auVar56 [14];
  undefined1 auVar57 [12];
  unkbyte10 Var58;
  ulong uVar59;
  long lVar60;
  uint uVar61;
  uint16_t uVar62;
  short *psVar63;
  ulong uVar64;
  bool bVar65;
  int iVar66;
  int iVar68;
  undefined1 auVar67 [16];
  short sVar69;
  short sVar70;
  short sVar71;
  short sVar72;
  short sVar73;
  short sVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [12];
  undefined1 auVar78 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  ushort uVar89;
  ushort uVar113;
  ushort uVar115;
  ushort uVar117;
  ushort uVar119;
  short sVar121;
  short sVar122;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  short sVar120;
  short sVar123;
  undefined1 auVar93 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar107 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar124 [16];
  ushort uVar128;
  ushort uVar129;
  ushort uVar130;
  ushort uVar131;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  uint uVar132;
  short sVar137;
  short sVar138;
  short sVar139;
  short sVar140;
  short sVar141;
  short sVar142;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  ushort uVar143;
  ushort uVar146;
  ushort uVar147;
  ushort uVar148;
  ushort uVar149;
  ushort uVar150;
  ushort uVar151;
  undefined1 auVar144 [16];
  ushort uVar152;
  undefined1 auVar145 [16];
  undefined1 auVar153 [12];
  ushort uVar160;
  ushort uVar161;
  ushort uVar162;
  ushort uVar163;
  ushort uVar164;
  ushort uVar165;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  ushort uVar166;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  ushort uVar172;
  undefined1 auVar171 [16];
  undefined1 auVar173 [12];
  ushort uVar179;
  undefined1 auVar174 [16];
  ushort uVar178;
  ushort uVar180;
  undefined1 auVar175 [16];
  undefined1 auVar177 [16];
  ushort uVar181;
  ushort uVar187;
  ushort uVar188;
  ushort uVar189;
  ushort uVar190;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  ushort uVar191;
  undefined1 auVar192 [12];
  ushort uVar197;
  ushort uVar198;
  ushort uVar199;
  ushort uVar200;
  undefined1 auVar194 [16];
  undefined1 auVar196 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined8 local_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined1 auVar79 [16];
  undefined1 auVar77 [16];
  undefined1 auVar80 [16];
  short sVar86;
  short sVar87;
  short sVar88;
  undefined8 uVar90;
  undefined1 auVar94 [16];
  undefined1 auVar104 [16];
  undefined1 auVar108 [16];
  undefined1 auVar95 [16];
  undefined1 auVar105 [16];
  undefined1 auVar109 [16];
  undefined1 auVar96 [16];
  undefined1 auVar106 [16];
  undefined1 auVar110 [16];
  short sVar114;
  short sVar116;
  short sVar118;
  undefined1 auVar133 [12];
  undefined1 auVar134 [16];
  undefined1 auVar157 [16];
  undefined1 auVar176 [16];
  undefined8 uVar182;
  undefined1 auVar183 [16];
  undefined1 auVar193 [16];
  undefined1 auVar195 [16];
  
  auVar67 = pshuflw(ZEXT416(*(uint *)zbin_ptr),ZEXT416(*(uint *)zbin_ptr),0x60);
  iVar66 = (auVar67._0_4_ >> 0x10) + 2 >> 2;
  iVar68 = (auVar67._4_4_ >> 0x10) + 2 >> 2;
  local_70 = CONCAT44(iVar68,iVar66);
  auVar67 = pshuflw(ZEXT416(*(uint *)dequant_ptr),ZEXT416(*(uint *)dequant_ptr),0xd4);
  auVar67 = pmaddwd(auVar67,_DAT_00515270);
  auVar124._8_4_ = 0xffffffff;
  auVar124._0_8_ = 0xffffffffffffffff;
  auVar124._12_4_ = 0xffffffff;
  iVar68 = iVar68 * 0x20 + -1 + (auVar67._4_4_ + 0x40 >> 7);
  uVar128 = (ushort)(zbin_ptr[4] + 2U) >> 2;
  uVar129 = (ushort)(zbin_ptr[5] + 2U) >> 2;
  uVar130 = (ushort)(zbin_ptr[6] + 2U) >> 2;
  uVar131 = (ushort)(zbin_ptr[7] + 2U) >> 2;
  sVar70 = uVar128 - 1;
  sVar71 = uVar129 - 1;
  sVar72 = uVar130 - 1;
  sVar73 = uVar131 - 1;
  auVar154 = packssdw(*(undefined1 (*) [16])coeff_ptr,*(undefined1 (*) [16])(coeff_ptr + 4));
  auVar167 = packssdw(*(undefined1 (*) [16])(coeff_ptr + 8),*(undefined1 (*) [16])(coeff_ptr + 0xc))
  ;
  sVar86 = auVar154._0_2_;
  sVar137 = -sVar86;
  sVar87 = auVar154._2_2_;
  sVar69 = -sVar87;
  sVar88 = auVar154._4_2_;
  sVar74 = -sVar88;
  sVar114 = auVar154._6_2_;
  sVar141 = -sVar114;
  sVar116 = auVar154._8_2_;
  sVar3 = -sVar116;
  sVar118 = auVar154._10_2_;
  sVar4 = -sVar118;
  sVar120 = auVar154._12_2_;
  sVar5 = -sVar120;
  sVar121 = auVar154._14_2_;
  sVar6 = -sVar121;
  uVar89 = (ushort)(sVar137 < sVar86) * sVar86 | (ushort)(sVar137 >= sVar86) * sVar137;
  uVar113 = (ushort)(sVar69 < sVar87) * sVar87 | (ushort)(sVar69 >= sVar87) * sVar69;
  uVar115 = (ushort)(sVar74 < sVar88) * sVar88 | (ushort)(sVar74 >= sVar88) * sVar74;
  uVar117 = (ushort)(sVar141 < sVar114) * sVar114 | (ushort)(sVar141 >= sVar114) * sVar141;
  uVar90 = CONCAT26(uVar117,CONCAT24(uVar115,CONCAT22(uVar113,uVar89)));
  uVar119 = (ushort)(sVar3 < sVar116) * sVar116 | (ushort)(sVar3 >= sVar116) * sVar3;
  auVar201._0_10_ = CONCAT28(uVar119,uVar90);
  auVar201._10_2_ = (ushort)(sVar4 < sVar118) * sVar118 | (ushort)(sVar4 >= sVar118) * sVar4;
  auVar201._12_2_ = (ushort)(sVar5 < sVar120) * sVar120 | (ushort)(sVar5 >= sVar120) * sVar5;
  auVar201._14_2_ = (ushort)(sVar6 < sVar121) * sVar121 | (ushort)(sVar6 >= sVar121) * sVar6;
  sVar86 = auVar167._0_2_;
  sVar137 = -sVar86;
  sVar87 = auVar167._2_2_;
  sVar69 = -sVar87;
  sVar88 = auVar167._4_2_;
  sVar74 = -sVar88;
  sVar114 = auVar167._6_2_;
  sVar141 = -sVar114;
  sVar116 = auVar167._8_2_;
  sVar3 = -sVar116;
  sVar118 = auVar167._10_2_;
  sVar4 = -sVar118;
  sVar120 = auVar167._12_2_;
  sVar5 = -sVar120;
  sVar121 = auVar167._14_2_;
  sVar6 = -sVar121;
  uVar181 = (ushort)(sVar137 < sVar86) * sVar86 | (ushort)(sVar137 >= sVar86) * sVar137;
  uVar187 = (ushort)(sVar69 < sVar87) * sVar87 | (ushort)(sVar69 >= sVar87) * sVar69;
  uVar188 = (ushort)(sVar74 < sVar88) * sVar88 | (ushort)(sVar74 >= sVar88) * sVar74;
  uVar189 = (ushort)(sVar141 < sVar114) * sVar114 | (ushort)(sVar141 >= sVar114) * sVar141;
  uVar182 = CONCAT26(uVar189,CONCAT24(uVar188,CONCAT22(uVar187,uVar181)));
  uVar190 = (ushort)(sVar3 < sVar116) * sVar116 | (ushort)(sVar3 >= sVar116) * sVar3;
  auVar183._0_10_ = CONCAT28(uVar190,uVar182);
  auVar183._10_2_ = (ushort)(sVar4 < sVar118) * sVar118 | (ushort)(sVar4 >= sVar118) * sVar4;
  auVar183._12_2_ = (ushort)(sVar5 < sVar120) * sVar120 | (ushort)(sVar5 >= sVar120) * sVar5;
  auVar183._14_2_ = (ushort)(sVar6 < sVar121) * sVar121 | (ushort)(sVar6 >= sVar121) * sVar6;
  auVar14._10_2_ = 0;
  auVar14._0_10_ = auVar201._0_10_;
  auVar14._12_2_ = uVar117;
  auVar22._8_2_ = uVar115;
  auVar22._0_8_ = uVar90;
  auVar22._10_4_ = auVar14._10_4_;
  auVar45._6_8_ = 0;
  auVar45._0_6_ = auVar22._8_6_;
  auVar29._4_2_ = uVar113;
  auVar29._0_4_ = CONCAT22(uVar113,uVar89);
  auVar29._6_8_ = SUB148(auVar45 << 0x40,6);
  auVar9._10_2_ = 0;
  auVar9._0_10_ = auVar183._0_10_;
  auVar9._12_2_ = uVar189;
  auVar15._8_2_ = uVar188;
  auVar15._0_8_ = uVar182;
  auVar15._10_4_ = auVar9._10_4_;
  auVar46._6_8_ = 0;
  auVar46._0_6_ = auVar15._8_6_;
  auVar25._4_2_ = uVar187;
  auVar25._0_4_ = CONCAT22(uVar187,uVar181);
  auVar25._6_8_ = SUB148(auVar46 << 0x40,6);
  auVar67._0_4_ =
       -(uint)(iVar66 * 0x20 + -1 + (auVar67._0_4_ + 0x40 >> 7) < (int)((uint)uVar89 << 5));
  auVar67._4_4_ = -(uint)(iVar68 < auVar29._4_4_ << 5);
  auVar67._8_4_ = -(uint)(iVar68 < auVar22._8_4_ << 5);
  auVar67._12_4_ = -(uint)(iVar68 < (int)((auVar14._10_4_ >> 0x10) << 5));
  auVar75._0_4_ = -(uint)(iVar68 < (int)((uint)uVar119 << 5));
  auVar75._4_4_ = -(uint)(iVar68 < (int)((uint)auVar201._10_2_ << 5));
  auVar75._8_4_ = -(uint)(iVar68 < (int)((uint)auVar201._12_2_ << 5));
  auVar75._12_4_ = -(uint)(iVar68 < (int)((uint)auVar201._14_2_ << 5));
  auVar75 = packssdw(auVar67,auVar75);
  auVar144._0_4_ = -(uint)(iVar68 < (int)((uint)uVar181 << 5));
  auVar144._4_4_ = -(uint)(iVar68 < auVar25._4_4_ << 5);
  auVar144._8_4_ = -(uint)(iVar68 < auVar15._8_4_ << 5);
  auVar144._12_4_ = -(uint)(iVar68 < (int)((auVar9._10_4_ >> 0x10) << 5));
  auVar155._0_4_ = -(uint)(iVar68 < (int)((uint)uVar190 << 5));
  auVar155._4_4_ = -(uint)(iVar68 < (int)((uint)auVar183._10_2_ << 5));
  auVar155._8_4_ = -(uint)(iVar68 < (int)((uint)auVar183._12_2_ << 5));
  auVar155._12_4_ = -(uint)(iVar68 < (int)((uint)auVar183._14_2_ << 5));
  auVar144 = packssdw(auVar144,auVar155);
  auVar67 = auVar144 | auVar75;
  uVar143 = 0;
  uVar146 = 0;
  uVar147 = 0;
  uVar148 = 0;
  uVar149 = 0;
  uVar150 = 0;
  uVar151 = 0;
  uVar152 = 0;
  bVar43 = (auVar67 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar44 = (auVar67 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar42 = (auVar67 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar41 = (auVar67 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar40 = (auVar67 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar39 = (auVar67 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar38 = (auVar67 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar37 = (auVar67 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar36 = (auVar67 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar35 = (auVar67 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar34 = (auVar67 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar33 = (auVar67 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar32 = (auVar67 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar30 = (auVar67 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar8 = (auVar67 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar65 = auVar67[0xf] < '\0';
  if (((((((((((((((bVar43 || bVar44) || bVar42) || bVar41) || bVar40) || bVar39) || bVar38) ||
             bVar37) || bVar36) || bVar35) || bVar34) || bVar33) || bVar32) || bVar30) || bVar8) ||
      bVar65) {
    auVar75 = auVar75 & *(undefined1 (*) [16])iscan;
    auVar144 = auVar144 & *(undefined1 (*) [16])(iscan + 8);
    sVar137 = auVar75._0_2_;
    sVar69 = auVar144._0_2_;
    uVar143 = (ushort)(sVar69 < sVar137) * sVar137 | (ushort)(sVar69 >= sVar137) * sVar69;
    sVar137 = auVar75._2_2_;
    sVar69 = auVar144._2_2_;
    uVar146 = (ushort)(sVar69 < sVar137) * sVar137 | (ushort)(sVar69 >= sVar137) * sVar69;
    sVar137 = auVar75._4_2_;
    sVar69 = auVar144._4_2_;
    uVar147 = (ushort)(sVar69 < sVar137) * sVar137 | (ushort)(sVar69 >= sVar137) * sVar69;
    sVar137 = auVar75._6_2_;
    sVar69 = auVar144._6_2_;
    uVar148 = (ushort)(sVar69 < sVar137) * sVar137 | (ushort)(sVar69 >= sVar137) * sVar69;
    sVar137 = auVar75._8_2_;
    sVar69 = auVar144._8_2_;
    uVar149 = (ushort)(sVar69 < sVar137) * sVar137 | (ushort)(sVar69 >= sVar137) * sVar69;
    sVar137 = auVar75._10_2_;
    sVar69 = auVar144._10_2_;
    uVar150 = (ushort)(sVar69 < sVar137) * sVar137 | (ushort)(sVar69 >= sVar137) * sVar69;
    sVar137 = auVar75._12_2_;
    sVar69 = auVar144._12_2_;
    sVar74 = auVar144._14_2_;
    uVar151 = (ushort)(sVar69 < sVar137) * sVar137 | (ushort)(sVar69 >= sVar137) * sVar69;
    sVar137 = auVar75._14_2_;
    uVar152 = (ushort)(sVar74 < sVar137) * sVar137 | (ushort)(sVar74 >= sVar137) * sVar74;
  }
  bVar65 = ((((((((((((((bVar43 || bVar44) || bVar42) || bVar41) || bVar40) || bVar39) || bVar38) ||
                  bVar37) || bVar36) || bVar35) || bVar34) || bVar33) || bVar32) || bVar30) || bVar8
           ) || bVar65;
  auVar125._0_2_ = -(ushort)((short)uVar89 < (short)((ushort)(*zbin_ptr + 2U) >> 2));
  auVar125._2_2_ = -(ushort)((short)uVar113 < (short)((ushort)(zbin_ptr[1] + 2U) >> 2));
  auVar125._4_2_ = -(ushort)((short)uVar115 < (short)((ushort)(zbin_ptr[2] + 2U) >> 2));
  auVar125._6_2_ = -(ushort)((short)uVar117 < (short)((ushort)(zbin_ptr[3] + 2U) >> 2));
  auVar125._8_2_ = -(ushort)((short)uVar119 < (short)uVar128);
  auVar125._10_2_ = -(ushort)((short)auVar201._10_2_ < (short)uVar129);
  auVar125._12_2_ = -(ushort)((short)auVar201._12_2_ < (short)uVar130);
  auVar125._14_2_ = -(ushort)((short)auVar201._14_2_ < (short)uVar131);
  auVar174._0_2_ = -(ushort)(sVar70 < (short)uVar181);
  auVar174._2_2_ = -(ushort)(sVar71 < (short)uVar187);
  auVar174._4_2_ = -(ushort)(sVar72 < (short)uVar188);
  auVar174._6_2_ = -(ushort)(sVar73 < (short)uVar189);
  auVar174._8_2_ = -(ushort)(sVar70 < (short)uVar190);
  auVar174._10_2_ = -(ushort)(sVar71 < (short)auVar183._10_2_);
  auVar174._12_2_ = -(ushort)(sVar72 < (short)auVar183._12_2_);
  auVar174._14_2_ = -(ushort)(sVar73 < (short)auVar183._14_2_);
  auVar67 = auVar174 | auVar124 ^ auVar125;
  cVar7 = auVar67[0xf];
  uVar113 = 0;
  uVar115 = 0;
  uVar130 = 0;
  uVar89 = 0;
  uVar129 = 0;
  uVar128 = 0;
  uVar119 = 0;
  uVar117 = 0;
  bVar43 = (auVar67 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar44 = (auVar67 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar42 = (auVar67 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar41 = (auVar67 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar40 = (auVar67 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar39 = (auVar67 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar38 = (auVar67 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar37 = (auVar67 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar36 = (auVar67 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar35 = (auVar67 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar34 = (auVar67 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar33 = (auVar67 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar32 = (auVar67 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar30 = (auVar67 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar8 = (auVar67 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  if (((((((((((((((bVar43 || bVar44) || bVar42) || bVar41) || bVar40) || bVar39) || bVar38) ||
             bVar37) || bVar36) || bVar35) || bVar34) || bVar33) || bVar32) || bVar30) || bVar8) ||
      cVar7 < '\0') {
    auVar124 = (auVar124 ^ auVar125) & *(undefined1 (*) [16])iscan;
    auVar75 = *(undefined1 (*) [16])(iscan + 8) & auVar174;
    sVar137 = auVar124._0_2_;
    sVar69 = auVar75._0_2_;
    uVar113 = (ushort)(sVar69 < sVar137) * sVar137 | (ushort)(sVar69 >= sVar137) * sVar69;
    sVar137 = auVar124._2_2_;
    sVar69 = auVar75._2_2_;
    uVar115 = (ushort)(sVar69 < sVar137) * sVar137 | (ushort)(sVar69 >= sVar137) * sVar69;
    sVar137 = auVar124._4_2_;
    sVar69 = auVar75._4_2_;
    uVar130 = (ushort)(sVar69 < sVar137) * sVar137 | (ushort)(sVar69 >= sVar137) * sVar69;
    sVar137 = auVar124._6_2_;
    sVar69 = auVar75._6_2_;
    uVar89 = (ushort)(sVar69 < sVar137) * sVar137 | (ushort)(sVar69 >= sVar137) * sVar69;
    sVar137 = auVar124._8_2_;
    sVar69 = auVar75._8_2_;
    uVar129 = (ushort)(sVar69 < sVar137) * sVar137 | (ushort)(sVar69 >= sVar137) * sVar69;
    sVar137 = auVar124._10_2_;
    sVar69 = auVar75._10_2_;
    uVar128 = (ushort)(sVar69 < sVar137) * sVar137 | (ushort)(sVar69 >= sVar137) * sVar69;
    sVar137 = auVar124._12_2_;
    sVar69 = auVar75._12_2_;
    sVar74 = auVar75._14_2_;
    uVar119 = (ushort)(sVar69 < sVar137) * sVar137 | (ushort)(sVar69 >= sVar137) * sVar69;
    sVar137 = auVar124._14_2_;
    uVar117 = (ushort)(sVar74 < sVar137) * sVar137 | (ushort)(sVar74 >= sVar137) * sVar74;
  }
  bVar8 = ((((((((((((((bVar43 || bVar44) || bVar42) || bVar41) || bVar40) || bVar39) || bVar38) ||
                 bVar37) || bVar36) || bVar35) || bVar34) || bVar33) || bVar32) || bVar30) || bVar8)
          || cVar7 < '\0';
  auVar75 = *(undefined1 (*) [16])quant_ptr;
  auVar124 = *(undefined1 (*) [16])dequant_ptr;
  auVar144 = *(undefined1 (*) [16])quant_shift_ptr;
  auVar76._0_2_ = (ushort)(*round_ptr + 2U) >> 2;
  auVar76._2_2_ = (ushort)(round_ptr[1] + 2U) >> 2;
  auVar76._4_2_ = (ushort)(round_ptr[2] + 2U) >> 2;
  auVar76._6_2_ = (ushort)(round_ptr[3] + 2U) >> 2;
  auVar76._8_2_ = (ushort)(round_ptr[4] + 2U) >> 2;
  auVar76._10_2_ = (ushort)(round_ptr[5] + 2U) >> 2;
  auVar77._12_2_ = (ushort)(round_ptr[6] + 2U) >> 2;
  auVar77._0_12_ = auVar76;
  auVar77._14_2_ = (ushort)(round_ptr[7] + 2U) >> 2;
  local_38._8_4_ = auVar76._8_4_;
  local_38._12_4_ = auVar77._12_4_;
  local_48._0_8_ = auVar75._8_8_;
  local_58._0_8_ = auVar144._8_8_;
  local_68._0_8_ = auVar124._8_8_;
  if ((((((((((((((((auVar67 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar67 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar67 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar67 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar67 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar67 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar67 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar67 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar67 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar67 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar67 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar67 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar67 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
       (auVar67 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar67 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < cVar7) {
    *(undefined1 (*) [16])(qcoeff_ptr + 0xc) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(qcoeff_ptr + 8) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(qcoeff_ptr + 4) = (undefined1  [16])0x0;
    qcoeff_ptr[0] = 0;
    qcoeff_ptr[1] = 0;
    qcoeff_ptr[2] = 0;
    qcoeff_ptr[3] = 0;
    local_38._4_4_ = local_38._12_4_;
    local_38._0_4_ = local_38._8_4_;
    local_48._8_4_ = auVar75._8_4_;
    local_48._12_4_ = auVar75._12_4_;
    local_58._8_4_ = auVar144._8_4_;
    local_58._12_4_ = auVar144._12_4_;
    local_68._8_4_ = auVar124._8_4_;
    local_68._12_4_ = auVar124._12_4_;
    *(undefined1 (*) [16])(dqcoeff_ptr + 0xc) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(dqcoeff_ptr + 8) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(dqcoeff_ptr + 4) = (undefined1  [16])0x0;
    dqcoeff_ptr[0] = 0;
    dqcoeff_ptr[1] = 0;
    dqcoeff_ptr[2] = 0;
    dqcoeff_ptr[3] = 0;
  }
  else {
    auVar155 = psraw(auVar154,0xf);
    auVar168 = psraw(auVar167,0xf);
    auVar67 = paddsw(auVar201,auVar77);
    auVar201 = pmulhw(auVar67,auVar75);
    auVar202._0_2_ = auVar201._0_2_ + auVar67._0_2_;
    auVar202._2_2_ = auVar201._2_2_ + auVar67._2_2_;
    auVar202._4_2_ = auVar201._4_2_ + auVar67._4_2_;
    auVar202._6_2_ = auVar201._6_2_ + auVar67._6_2_;
    auVar202._8_2_ = auVar201._8_2_ + auVar67._8_2_;
    auVar202._10_2_ = auVar201._10_2_ + auVar67._10_2_;
    auVar202._12_2_ = auVar201._12_2_ + auVar67._12_2_;
    auVar202._14_2_ = auVar201._14_2_ + auVar67._14_2_;
    sVar137 = auVar144._8_2_;
    sVar69 = auVar144._10_2_;
    sVar74 = auVar144._12_2_;
    sVar141 = auVar144._14_2_;
    auVar67 = pmulhw(auVar202,auVar144);
    auVar91._0_2_ = (ushort)(auVar202._0_2_ * auVar144._0_2_) >> 0xe;
    auVar91._2_2_ = (ushort)(auVar202._2_2_ * auVar144._2_2_) >> 0xe;
    auVar91._4_2_ = (ushort)(auVar202._4_2_ * auVar144._4_2_) >> 0xe;
    auVar91._6_2_ = (ushort)(auVar202._6_2_ * auVar144._6_2_) >> 0xe;
    auVar91._8_2_ = (ushort)(auVar202._8_2_ * sVar137) >> 0xe;
    auVar91._10_2_ = (ushort)(auVar202._10_2_ * sVar69) >> 0xe;
    auVar91._12_2_ = (ushort)(auVar202._12_2_ * sVar74) >> 0xe;
    auVar91._14_2_ = (ushort)(auVar202._14_2_ * sVar141) >> 0xe;
    auVar201 = psllw(auVar67,2);
    local_38._4_4_ = local_38._12_4_;
    local_38._0_4_ = local_38._8_4_;
    local_48._8_4_ = auVar75._8_4_;
    local_48._12_4_ = auVar75._12_4_;
    local_58._8_4_ = auVar144._8_4_;
    local_58._12_4_ = auVar144._12_4_;
    auVar75 = paddsw(auVar183,local_38);
    auVar67 = pmulhw(auVar75,local_48);
    auVar154._0_2_ = auVar67._0_2_ + auVar75._0_2_;
    auVar154._2_2_ = auVar67._2_2_ + auVar75._2_2_;
    auVar154._4_2_ = auVar67._4_2_ + auVar75._4_2_;
    auVar154._6_2_ = auVar67._6_2_ + auVar75._6_2_;
    auVar154._8_2_ = auVar67._8_2_ + auVar75._8_2_;
    auVar154._10_2_ = auVar67._10_2_ + auVar75._10_2_;
    auVar154._12_2_ = auVar67._12_2_ + auVar75._12_2_;
    auVar154._14_2_ = auVar67._14_2_ + auVar75._14_2_;
    auVar67 = pmulhw(auVar154,local_58);
    auVar92._0_2_ = (ushort)(auVar154._0_2_ * sVar137) >> 0xe;
    auVar92._2_2_ = (ushort)(auVar154._2_2_ * sVar69) >> 0xe;
    auVar92._4_2_ = (ushort)(auVar154._4_2_ * sVar74) >> 0xe;
    auVar92._6_2_ = (ushort)(auVar154._6_2_ * sVar141) >> 0xe;
    auVar92._8_2_ = (ushort)(auVar154._8_2_ * sVar137) >> 0xe;
    auVar92._10_2_ = (ushort)(auVar154._10_2_ * sVar69) >> 0xe;
    auVar92._12_2_ = (ushort)(auVar154._12_2_ * sVar74) >> 0xe;
    auVar92._14_2_ = (ushort)(auVar154._14_2_ * sVar141) >> 0xe;
    auVar67 = psllw(auVar67,2);
    auVar75 = (auVar201 | auVar91) ^ auVar155;
    auVar126._0_2_ = auVar75._0_2_ - auVar155._0_2_;
    auVar126._2_2_ = auVar75._2_2_ - auVar155._2_2_;
    auVar126._4_2_ = auVar75._4_2_ - auVar155._4_2_;
    auVar126._6_2_ = auVar75._6_2_ - auVar155._6_2_;
    auVar126._8_2_ = auVar75._8_2_ - auVar155._8_2_;
    auVar126._10_2_ = auVar75._10_2_ - auVar155._10_2_;
    auVar126._12_2_ = auVar75._12_2_ - auVar155._12_2_;
    auVar126._14_2_ = auVar75._14_2_ - auVar155._14_2_;
    auVar67 = (auVar67 | auVar92) ^ auVar168;
    auVar167._0_2_ = auVar67._0_2_ - auVar168._0_2_;
    auVar167._2_2_ = auVar67._2_2_ - auVar168._2_2_;
    auVar167._4_2_ = auVar67._4_2_ - auVar168._4_2_;
    auVar167._6_2_ = auVar67._6_2_ - auVar168._6_2_;
    auVar167._8_2_ = auVar67._8_2_ - auVar168._8_2_;
    auVar167._10_2_ = auVar67._10_2_ - auVar168._10_2_;
    auVar167._12_2_ = auVar67._12_2_ - auVar168._12_2_;
    auVar167._14_2_ = auVar67._14_2_ - auVar168._14_2_;
    auVar126 = ~auVar125 & auVar126;
    auVar174 = auVar174 & auVar167;
    auVar75 = psraw(auVar126,0xf);
    sVar88 = auVar126._6_2_;
    auVar80._0_12_ = auVar126._0_12_;
    auVar80._12_2_ = sVar88;
    auVar80._14_2_ = auVar75._6_2_;
    auVar79._12_4_ = auVar80._12_4_;
    auVar79._0_10_ = auVar126._0_10_;
    auVar79._10_2_ = auVar75._4_2_;
    sVar87 = auVar126._4_2_;
    auVar168._10_6_ = auVar79._10_6_;
    auVar168._0_8_ = auVar126._0_8_;
    auVar168._8_2_ = sVar87;
    auVar78._8_8_ = auVar168._8_8_;
    auVar78._6_2_ = auVar75._2_2_;
    sVar86 = auVar126._2_2_;
    auVar78._4_2_ = sVar86;
    auVar78._0_2_ = auVar126._0_2_;
    auVar78._2_2_ = auVar75._0_2_;
    sVar120 = auVar126._8_2_;
    sVar121 = auVar126._10_2_;
    uVar188 = auVar75._10_2_;
    sVar122 = auVar126._12_2_;
    uVar189 = auVar75._12_2_;
    sVar123 = auVar126._14_2_;
    uVar190 = auVar75._14_2_;
    *(undefined1 (*) [16])qcoeff_ptr = auVar78;
    *(short *)(qcoeff_ptr + 4) = sVar120;
    *(ushort *)((long)qcoeff_ptr + 0x12) = auVar75._8_2_;
    *(short *)(qcoeff_ptr + 5) = sVar121;
    *(ushort *)((long)qcoeff_ptr + 0x16) = uVar188;
    *(short *)(qcoeff_ptr + 6) = sVar122;
    *(ushort *)((long)qcoeff_ptr + 0x1a) = uVar189;
    *(short *)(qcoeff_ptr + 7) = sVar123;
    *(ushort *)((long)qcoeff_ptr + 0x1e) = uVar190;
    auVar67 = psraw(auVar174,0xf);
    sVar118 = auVar174._6_2_;
    auVar96._0_12_ = auVar174._0_12_;
    auVar96._12_2_ = sVar118;
    auVar96._14_2_ = auVar67._6_2_;
    auVar95._12_4_ = auVar96._12_4_;
    auVar95._0_10_ = auVar174._0_10_;
    auVar95._10_2_ = auVar67._4_2_;
    sVar116 = auVar174._4_2_;
    auVar94._10_6_ = auVar95._10_6_;
    auVar94._0_8_ = auVar174._0_8_;
    auVar94._8_2_ = sVar116;
    auVar93._8_8_ = auVar94._8_8_;
    auVar93._6_2_ = auVar67._2_2_;
    sVar114 = auVar174._2_2_;
    auVar93._4_2_ = sVar114;
    auVar93._0_2_ = auVar174._0_2_;
    auVar93._2_2_ = auVar67._0_2_;
    sVar138 = auVar174._8_2_;
    sVar139 = auVar174._10_2_;
    uVar131 = auVar67._10_2_;
    sVar140 = auVar174._12_2_;
    uVar181 = auVar67._12_2_;
    sVar142 = auVar174._14_2_;
    uVar187 = auVar67._14_2_;
    *(undefined1 (*) [16])(qcoeff_ptr + 8) = auVar93;
    *(short *)(qcoeff_ptr + 0xc) = sVar138;
    *(ushort *)((long)qcoeff_ptr + 0x32) = auVar67._8_2_;
    *(short *)(qcoeff_ptr + 0xd) = sVar139;
    *(ushort *)((long)qcoeff_ptr + 0x36) = uVar131;
    *(short *)(qcoeff_ptr + 0xe) = sVar140;
    *(ushort *)((long)qcoeff_ptr + 0x3a) = uVar181;
    *(short *)(qcoeff_ptr + 0xf) = sVar142;
    *(ushort *)((long)qcoeff_ptr + 0x3e) = uVar187;
    sVar137 = -auVar78._0_2_;
    sVar69 = -sVar86;
    sVar74 = -sVar87;
    sVar141 = -sVar88;
    sVar3 = -sVar120;
    sVar4 = -sVar121;
    sVar5 = -sVar122;
    sVar6 = -sVar123;
    auVar97._0_2_ =
         (ushort)(sVar137 < auVar78._0_2_) * auVar78._0_2_ |
         (ushort)(sVar137 >= auVar78._0_2_) * sVar137;
    auVar97._2_2_ = (ushort)(sVar69 < sVar86) * sVar86 | (ushort)(sVar69 >= sVar86) * sVar69;
    auVar97._4_2_ = (ushort)(sVar74 < sVar87) * sVar87 | (ushort)(sVar74 >= sVar87) * sVar74;
    auVar97._6_2_ = (ushort)(sVar141 < sVar88) * sVar88 | (ushort)(sVar141 >= sVar88) * sVar141;
    auVar97._8_2_ = (ushort)(sVar3 < sVar120) * sVar120 | (ushort)(sVar3 >= sVar120) * sVar3;
    auVar97._10_2_ = (ushort)(sVar4 < sVar121) * sVar121 | (ushort)(sVar4 >= sVar121) * sVar4;
    auVar97._12_2_ = (ushort)(sVar5 < sVar122) * sVar122 | (ushort)(sVar5 >= sVar122) * sVar5;
    auVar97._14_2_ = (ushort)(sVar6 < sVar123) * sVar123 | (ushort)(sVar6 >= sVar123) * sVar6;
    auVar16._10_2_ = 0;
    auVar16._0_10_ = auVar75._0_10_;
    auVar16._12_2_ = auVar75._6_2_;
    auVar23._8_2_ = auVar75._4_2_;
    auVar23._0_8_ = auVar75._0_8_;
    auVar23._10_4_ = auVar16._10_4_;
    auVar47._6_8_ = 0;
    auVar47._0_6_ = auVar23._8_6_;
    Var48 = CONCAT82(SUB148(auVar47 << 0x40,6),auVar75._2_2_);
    auVar127._0_4_ = CONCAT22(0,auVar75._0_2_);
    auVar127._4_10_ = Var48;
    auVar127._14_2_ = 0;
    auVar156._0_4_ = CONCAT22(0,auVar75._8_2_);
    auVar156._4_2_ = uVar188;
    auVar156._6_2_ = 0;
    auVar156._8_2_ = uVar189;
    auVar156._10_2_ = 0;
    auVar156._12_2_ = uVar190;
    auVar156._14_2_ = 0;
    sVar137 = auVar97._6_2_ * auVar124._6_2_;
    sVar86 = auVar124._8_2_;
    sVar87 = auVar124._10_2_;
    sVar88 = auVar124._12_2_;
    sVar120 = auVar124._14_2_;
    auVar75 = pmulhw(auVar97,auVar124);
    uVar61 = CONCAT22(auVar75._6_2_,sVar137);
    Var58 = CONCAT64(CONCAT42(uVar61,auVar75._4_2_),CONCAT22(auVar97._4_2_ * auVar124._4_2_,sVar137)
                    );
    auVar49._4_8_ = (long)((unkuint10)Var58 >> 0x10);
    auVar49._2_2_ = auVar75._2_2_;
    auVar49._0_2_ = auVar97._2_2_ * auVar124._2_2_;
    uVar132 = CONCAT22(auVar75._8_2_,auVar97._8_2_ * sVar86);
    auVar133._0_8_ = CONCAT26(auVar75._10_2_,CONCAT24(auVar97._10_2_ * sVar87,uVar132));
    auVar133._8_2_ = auVar97._12_2_ * sVar88;
    auVar133._10_2_ = auVar75._12_2_;
    auVar134._12_2_ = auVar97._14_2_ * sVar120;
    auVar134._0_12_ = auVar133;
    auVar134._14_2_ = auVar75._14_2_;
    auVar169._0_4_ = CONCAT22(auVar75._0_2_,auVar97._0_2_ * auVar124._0_2_) >> 2;
    auVar169._4_4_ = auVar49._0_4_ >> 2;
    auVar169._8_4_ = (uint)((unkuint10)Var58 >> 0x10) >> 2;
    auVar169._12_4_ = uVar61 >> 2;
    auVar135._0_4_ = uVar132 >> 2;
    auVar135._4_4_ = (uint)((ulong)auVar133._0_8_ >> 0x22);
    auVar135._8_4_ = auVar133._8_4_ >> 2;
    auVar135._12_4_ = auVar134._12_4_ >> 2;
    auVar169 = auVar169 ^ auVar127;
    auVar135 = auVar135 ^ auVar156;
    *dqcoeff_ptr = auVar169._0_4_ - auVar127._0_4_;
    dqcoeff_ptr[1] = auVar169._4_4_ - (int)Var48;
    dqcoeff_ptr[2] = auVar169._8_4_ - auVar23._8_4_;
    dqcoeff_ptr[3] = auVar169._12_4_ - (auVar16._10_4_ >> 0x10);
    dqcoeff_ptr[4] = auVar135._0_4_ - auVar156._0_4_;
    dqcoeff_ptr[5] = auVar135._4_4_ - (uint)uVar188;
    dqcoeff_ptr[6] = auVar135._8_4_ - (uint)uVar189;
    dqcoeff_ptr[7] = auVar135._12_4_ - (uint)uVar190;
    local_68._8_4_ = auVar124._8_4_;
    local_68._12_4_ = auVar124._12_4_;
    sVar137 = -auVar93._0_2_;
    sVar69 = -sVar114;
    sVar74 = -sVar116;
    sVar141 = -sVar118;
    sVar3 = -sVar138;
    sVar4 = -sVar139;
    sVar5 = -sVar140;
    sVar6 = -sVar142;
    auVar98._0_2_ =
         (ushort)(sVar137 < auVar93._0_2_) * auVar93._0_2_ |
         (ushort)(sVar137 >= auVar93._0_2_) * sVar137;
    auVar98._2_2_ = (ushort)(sVar69 < sVar114) * sVar114 | (ushort)(sVar69 >= sVar114) * sVar69;
    auVar98._4_2_ = (ushort)(sVar74 < sVar116) * sVar116 | (ushort)(sVar74 >= sVar116) * sVar74;
    auVar98._6_2_ = (ushort)(sVar141 < sVar118) * sVar118 | (ushort)(sVar141 >= sVar118) * sVar141;
    auVar98._8_2_ = (ushort)(sVar3 < sVar138) * sVar138 | (ushort)(sVar3 >= sVar138) * sVar3;
    auVar98._10_2_ = (ushort)(sVar4 < sVar139) * sVar139 | (ushort)(sVar4 >= sVar139) * sVar4;
    auVar98._12_2_ = (ushort)(sVar5 < sVar140) * sVar140 | (ushort)(sVar5 >= sVar140) * sVar5;
    auVar98._14_2_ = (ushort)(sVar6 < sVar142) * sVar142 | (ushort)(sVar6 >= sVar142) * sVar6;
    auVar10._10_2_ = 0;
    auVar10._0_10_ = auVar67._0_10_;
    auVar10._12_2_ = auVar67._6_2_;
    auVar17._8_2_ = auVar67._4_2_;
    auVar17._0_8_ = auVar67._0_8_;
    auVar17._10_4_ = auVar10._10_4_;
    auVar50._6_8_ = 0;
    auVar50._0_6_ = auVar17._8_6_;
    auVar26._4_2_ = auVar67._2_2_;
    auVar26._0_4_ = auVar67._0_4_;
    auVar26._6_8_ = SUB148(auVar50 << 0x40,6);
    auVar136._0_4_ = auVar67._0_4_ & 0xffff;
    auVar136._4_10_ = auVar26._4_10_;
    auVar136._14_2_ = 0;
    auVar81._0_4_ = CONCAT22(0,auVar67._8_2_);
    auVar81._4_2_ = uVar131;
    auVar81._6_2_ = 0;
    auVar81._8_2_ = uVar181;
    auVar81._10_2_ = 0;
    auVar81._12_2_ = uVar187;
    auVar81._14_2_ = 0;
    auVar67 = pmulhw(auVar98,local_68);
    uVar61 = CONCAT22(auVar67._6_2_,auVar98._6_2_ * sVar120);
    Var48 = CONCAT64(CONCAT42(uVar61,auVar67._4_2_),
                     CONCAT22(auVar98._4_2_ * sVar88,auVar98._6_2_ * sVar120));
    auVar51._4_8_ = (long)((unkuint10)Var48 >> 0x10);
    auVar51._2_2_ = auVar67._2_2_;
    auVar51._0_2_ = auVar98._2_2_ * sVar87;
    uVar132 = CONCAT22(auVar67._8_2_,auVar98._8_2_ * sVar86);
    auVar153._0_8_ = CONCAT26(auVar67._10_2_,CONCAT24(auVar98._10_2_ * sVar87,uVar132));
    auVar153._8_2_ = auVar98._12_2_ * sVar88;
    auVar153._10_2_ = auVar67._12_2_;
    auVar157._12_2_ = auVar98._14_2_ * sVar120;
    auVar157._0_12_ = auVar153;
    auVar157._14_2_ = auVar67._14_2_;
    auVar170._0_4_ = CONCAT22(auVar67._0_2_,auVar98._0_2_ * sVar86) >> 2;
    auVar170._4_4_ = auVar51._0_4_ >> 2;
    auVar170._8_4_ = (uint)((unkuint10)Var48 >> 0x10) >> 2;
    auVar170._12_4_ = uVar61 >> 2;
    auVar158._0_4_ = uVar132 >> 2;
    auVar158._4_4_ = (uint)((ulong)auVar153._0_8_ >> 0x22);
    auVar158._8_4_ = auVar153._8_4_ >> 2;
    auVar158._12_4_ = auVar157._12_4_ >> 2;
    auVar170 = auVar170 ^ auVar136;
    auVar158 = auVar158 ^ auVar81;
    dqcoeff_ptr[8] = auVar170._0_4_ - auVar136._0_4_;
    dqcoeff_ptr[9] = auVar170._4_4_ - auVar26._4_4_;
    dqcoeff_ptr[10] = auVar170._8_4_ - auVar17._8_4_;
    dqcoeff_ptr[0xb] = auVar170._12_4_ - (auVar10._10_4_ >> 0x10);
    dqcoeff_ptr[0xc] = auVar158._0_4_ - auVar81._0_4_;
    dqcoeff_ptr[0xd] = auVar158._4_4_ - (uint)uVar131;
    dqcoeff_ptr[0xe] = auVar158._8_4_ - (uint)uVar181;
    dqcoeff_ptr[0xf] = auVar158._12_4_ - (uint)uVar187;
  }
  uVar143 = (-1 < (short)uVar143) * uVar143;
  uVar146 = (-1 < (short)uVar146) * uVar146;
  uVar147 = (-1 < (short)uVar147) * uVar147;
  uVar148 = (-1 < (short)uVar148) * uVar148;
  uVar149 = (-1 < (short)uVar149) * uVar149;
  uVar150 = (-1 < (short)uVar150) * uVar150;
  uVar151 = (-1 < (short)uVar151) * uVar151;
  uVar152 = (-1 < (short)uVar152) * uVar152;
  uVar113 = (-1 < (short)uVar113) * uVar113;
  uVar115 = (-1 < (short)uVar115) * uVar115;
  uVar130 = (-1 < (short)uVar130) * uVar130;
  uVar89 = (-1 < (short)uVar89) * uVar89;
  uVar129 = (-1 < (short)uVar129) * uVar129;
  uVar128 = (-1 < (short)uVar128) * uVar128;
  uVar119 = (-1 < (short)uVar119) * uVar119;
  uVar117 = (-1 < (short)uVar117) * uVar117;
  if (0x10 < n_coeffs) {
    lVar60 = 0x10;
    do {
      auVar124 = packssdw(*(undefined1 (*) [16])(coeff_ptr + lVar60),
                          *(undefined1 (*) [16])(coeff_ptr + lVar60 + 4));
      auVar144 = packssdw(*(undefined1 (*) [16])(coeff_ptr + lVar60 + 8),
                          *(undefined1 (*) [16])(coeff_ptr + lVar60 + 0xc));
      sVar86 = auVar124._0_2_;
      sVar137 = -sVar86;
      sVar87 = auVar124._2_2_;
      sVar69 = -sVar87;
      sVar88 = auVar124._4_2_;
      sVar74 = -sVar88;
      sVar114 = auVar124._6_2_;
      sVar141 = -sVar114;
      sVar116 = auVar124._8_2_;
      sVar3 = -sVar116;
      sVar118 = auVar124._10_2_;
      sVar4 = -sVar118;
      sVar120 = auVar124._12_2_;
      sVar5 = -sVar120;
      sVar121 = auVar124._14_2_;
      sVar6 = -sVar121;
      uVar131 = (ushort)(sVar137 < sVar86) * sVar86 | (ushort)(sVar137 >= sVar86) * sVar137;
      uVar181 = (ushort)(sVar69 < sVar87) * sVar87 | (ushort)(sVar69 >= sVar87) * sVar69;
      uVar187 = (ushort)(sVar74 < sVar88) * sVar88 | (ushort)(sVar74 >= sVar88) * sVar74;
      uVar188 = (ushort)(sVar141 < sVar114) * sVar114 | (ushort)(sVar141 >= sVar114) * sVar141;
      uVar90 = CONCAT26(uVar188,CONCAT24(uVar187,CONCAT22(uVar181,uVar131)));
      uVar189 = (ushort)(sVar3 < sVar116) * sVar116 | (ushort)(sVar3 >= sVar116) * sVar3;
      auVar99._0_10_ = CONCAT28(uVar189,uVar90);
      auVar99._10_2_ = (ushort)(sVar4 < sVar118) * sVar118 | (ushort)(sVar4 >= sVar118) * sVar4;
      auVar99._12_2_ = (ushort)(sVar5 < sVar120) * sVar120 | (ushort)(sVar5 >= sVar120) * sVar5;
      auVar99._14_2_ = (ushort)(sVar6 < sVar121) * sVar121 | (ushort)(sVar6 >= sVar121) * sVar6;
      sVar86 = auVar144._0_2_;
      sVar137 = -sVar86;
      sVar87 = auVar144._2_2_;
      sVar69 = -sVar87;
      sVar88 = auVar144._4_2_;
      sVar74 = -sVar88;
      sVar114 = auVar144._6_2_;
      sVar141 = -sVar114;
      sVar116 = auVar144._8_2_;
      sVar3 = -sVar116;
      sVar118 = auVar144._10_2_;
      sVar4 = -sVar118;
      sVar120 = auVar144._12_2_;
      sVar5 = -sVar120;
      sVar121 = auVar144._14_2_;
      sVar6 = -sVar121;
      uVar191 = (ushort)(sVar137 < sVar86) * sVar86 | (ushort)(sVar137 >= sVar86) * sVar137;
      uVar197 = (ushort)(sVar69 < sVar87) * sVar87 | (ushort)(sVar69 >= sVar87) * sVar69;
      uVar198 = (ushort)(sVar74 < sVar88) * sVar88 | (ushort)(sVar74 >= sVar88) * sVar74;
      uVar199 = (ushort)(sVar141 < sVar114) * sVar114 | (ushort)(sVar141 >= sVar114) * sVar141;
      uVar182 = CONCAT26(uVar199,CONCAT24(uVar198,CONCAT22(uVar197,uVar191)));
      uVar200 = (ushort)(sVar3 < sVar116) * sVar116 | (ushort)(sVar3 >= sVar116) * sVar3;
      auVar193._0_10_ = CONCAT28(uVar200,uVar182);
      auVar193._10_2_ = (ushort)(sVar4 < sVar118) * sVar118 | (ushort)(sVar4 >= sVar118) * sVar4;
      auVar193._12_2_ = (ushort)(sVar5 < sVar120) * sVar120 | (ushort)(sVar5 >= sVar120) * sVar5;
      auVar193._14_2_ = (ushort)(sVar6 < sVar121) * sVar121 | (ushort)(sVar6 >= sVar121) * sVar6;
      auVar18._10_2_ = 0;
      auVar18._0_10_ = auVar99._0_10_;
      auVar18._12_2_ = uVar188;
      auVar24._8_2_ = uVar187;
      auVar24._0_8_ = uVar90;
      auVar24._10_4_ = auVar18._10_4_;
      auVar52._6_8_ = 0;
      auVar52._0_6_ = auVar24._8_6_;
      auVar31._4_2_ = uVar181;
      auVar31._0_4_ = CONCAT22(uVar181,uVar131);
      auVar31._6_8_ = SUB148(auVar52 << 0x40,6);
      auVar11._10_2_ = 0;
      auVar11._0_10_ = auVar193._0_10_;
      auVar11._12_2_ = uVar199;
      auVar19._8_2_ = uVar198;
      auVar19._0_8_ = uVar182;
      auVar19._10_4_ = auVar11._10_4_;
      auVar53._6_8_ = 0;
      auVar53._0_6_ = auVar19._8_6_;
      auVar27._4_2_ = uVar197;
      auVar27._0_4_ = CONCAT22(uVar197,uVar191);
      auVar27._6_8_ = SUB148(auVar53 << 0x40,6);
      auVar82._0_4_ = -(uint)(iVar68 < (int)((uint)uVar131 << 5));
      auVar82._4_4_ = -(uint)(iVar68 < auVar31._4_4_ << 5);
      auVar82._8_4_ = -(uint)(iVar68 < auVar24._8_4_ << 5);
      auVar82._12_4_ = -(uint)(iVar68 < (int)((auVar18._10_4_ >> 0x10) << 5));
      auVar145._0_4_ = -(uint)(iVar68 < (int)((uint)uVar189 << 5));
      auVar145._4_4_ = -(uint)(iVar68 < (int)((uint)auVar99._10_2_ << 5));
      auVar145._8_4_ = -(uint)(iVar68 < (int)((uint)auVar99._12_2_ << 5));
      auVar145._12_4_ = -(uint)(iVar68 < (int)((uint)auVar99._14_2_ << 5));
      auVar67 = packssdw(auVar82,auVar145);
      auVar159._0_4_ = -(uint)(iVar68 < (int)((uint)uVar191 << 5));
      auVar159._4_4_ = -(uint)(iVar68 < auVar27._4_4_ << 5);
      auVar159._8_4_ = -(uint)(iVar68 < auVar19._8_4_ << 5);
      auVar159._12_4_ = -(uint)(iVar68 < (int)((auVar11._10_4_ >> 0x10) << 5));
      auVar184._0_4_ = -(uint)(iVar68 < (int)((uint)uVar200 << 5));
      auVar184._4_4_ = -(uint)(iVar68 < (int)((uint)auVar193._10_2_ << 5));
      auVar184._8_4_ = -(uint)(iVar68 < (int)((uint)auVar193._12_2_ << 5));
      auVar184._12_4_ = -(uint)(iVar68 < (int)((uint)auVar193._14_2_ << 5));
      auVar201 = packssdw(auVar159,auVar184);
      auVar75 = auVar201 | auVar67;
      uVar190 = 0;
      uVar160 = 0;
      uVar161 = 0;
      uVar162 = 0;
      uVar163 = 0;
      uVar164 = 0;
      uVar165 = 0;
      uVar166 = 0;
      if ((((((((((((((((auVar75 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar75 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar75 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar75 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar75 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar75 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar75 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar75 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar75 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar75 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar75 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar75 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar75 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar75 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar75 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar75[0xf] < '\0'
         ) {
        auVar67 = auVar67 & *(undefined1 (*) [16])(iscan + lVar60);
        auVar201 = auVar201 & *(undefined1 (*) [16])(iscan + lVar60 + 8);
        sVar137 = auVar67._0_2_;
        sVar69 = auVar201._0_2_;
        uVar190 = (ushort)(sVar69 < sVar137) * sVar137 | (ushort)(sVar69 >= sVar137) * sVar69;
        sVar137 = auVar67._2_2_;
        sVar69 = auVar201._2_2_;
        uVar160 = (ushort)(sVar69 < sVar137) * sVar137 | (ushort)(sVar69 >= sVar137) * sVar69;
        sVar137 = auVar67._4_2_;
        sVar69 = auVar201._4_2_;
        uVar161 = (ushort)(sVar69 < sVar137) * sVar137 | (ushort)(sVar69 >= sVar137) * sVar69;
        sVar137 = auVar67._6_2_;
        sVar69 = auVar201._6_2_;
        uVar162 = (ushort)(sVar69 < sVar137) * sVar137 | (ushort)(sVar69 >= sVar137) * sVar69;
        sVar137 = auVar67._8_2_;
        sVar69 = auVar201._8_2_;
        uVar163 = (ushort)(sVar69 < sVar137) * sVar137 | (ushort)(sVar69 >= sVar137) * sVar69;
        sVar137 = auVar67._10_2_;
        sVar69 = auVar201._10_2_;
        uVar164 = (ushort)(sVar69 < sVar137) * sVar137 | (ushort)(sVar69 >= sVar137) * sVar69;
        sVar137 = auVar67._12_2_;
        sVar69 = auVar201._12_2_;
        sVar74 = auVar201._14_2_;
        uVar165 = (ushort)(sVar69 < sVar137) * sVar137 | (ushort)(sVar69 >= sVar137) * sVar69;
        sVar137 = auVar67._14_2_;
        uVar166 = (ushort)(sVar74 < sVar137) * sVar137 | (ushort)(sVar74 >= sVar137) * sVar74;
        bVar65 = true;
      }
      auVar83._0_2_ = -(ushort)(sVar70 < (short)uVar131);
      auVar83._2_2_ = -(ushort)(sVar71 < (short)uVar181);
      auVar83._4_2_ = -(ushort)(sVar72 < (short)uVar187);
      auVar83._6_2_ = -(ushort)(sVar73 < (short)uVar188);
      auVar83._8_2_ = -(ushort)(sVar70 < (short)uVar189);
      auVar83._10_2_ = -(ushort)(sVar71 < (short)auVar99._10_2_);
      auVar83._12_2_ = -(ushort)(sVar72 < (short)auVar99._12_2_);
      auVar83._14_2_ = -(ushort)(sVar73 < (short)auVar99._14_2_);
      auVar185._0_2_ = -(ushort)(sVar70 < (short)uVar191);
      auVar185._2_2_ = -(ushort)(sVar71 < (short)uVar197);
      auVar185._4_2_ = -(ushort)(sVar72 < (short)uVar198);
      auVar185._6_2_ = -(ushort)(sVar73 < (short)uVar199);
      auVar185._8_2_ = -(ushort)(sVar70 < (short)uVar200);
      auVar185._10_2_ = -(ushort)(sVar71 < (short)auVar193._10_2_);
      auVar185._12_2_ = -(ushort)(sVar72 < (short)auVar193._12_2_);
      auVar185._14_2_ = -(ushort)(sVar73 < (short)auVar193._14_2_);
      auVar67 = auVar185 | auVar83;
      if ((((((((((((((((auVar67 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (auVar67 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar67 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar67 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar67 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar67 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar67 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar67 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar67 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar67 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar67 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar67 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar67 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar67 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar67 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar67[0xf])
      {
        uVar131 = 0;
        uVar181 = 0;
        uVar187 = 0;
        uVar188 = 0;
        uVar189 = 0;
        uVar191 = 0;
        uVar197 = 0;
        uVar198 = 0;
      }
      else {
        auVar201 = *(undefined1 (*) [16])(iscan + lVar60) & auVar83;
        auVar75 = *(undefined1 (*) [16])(iscan + lVar60 + 8) & auVar185;
        sVar137 = auVar201._0_2_;
        sVar69 = auVar75._0_2_;
        uVar131 = (ushort)(sVar69 < sVar137) * sVar137 | (ushort)(sVar69 >= sVar137) * sVar69;
        sVar137 = auVar201._2_2_;
        sVar69 = auVar75._2_2_;
        uVar181 = (ushort)(sVar69 < sVar137) * sVar137 | (ushort)(sVar69 >= sVar137) * sVar69;
        sVar137 = auVar201._4_2_;
        sVar69 = auVar75._4_2_;
        uVar187 = (ushort)(sVar69 < sVar137) * sVar137 | (ushort)(sVar69 >= sVar137) * sVar69;
        sVar137 = auVar201._6_2_;
        sVar69 = auVar75._6_2_;
        uVar188 = (ushort)(sVar69 < sVar137) * sVar137 | (ushort)(sVar69 >= sVar137) * sVar69;
        sVar137 = auVar201._8_2_;
        sVar69 = auVar75._8_2_;
        uVar189 = (ushort)(sVar69 < sVar137) * sVar137 | (ushort)(sVar69 >= sVar137) * sVar69;
        sVar137 = auVar201._10_2_;
        sVar69 = auVar75._10_2_;
        uVar191 = (ushort)(sVar69 < sVar137) * sVar137 | (ushort)(sVar69 >= sVar137) * sVar69;
        sVar137 = auVar201._12_2_;
        sVar69 = auVar75._12_2_;
        sVar74 = auVar75._14_2_;
        uVar197 = (ushort)(sVar69 < sVar137) * sVar137 | (ushort)(sVar69 >= sVar137) * sVar69;
        sVar137 = auVar201._14_2_;
        uVar198 = (ushort)(sVar74 < sVar137) * sVar137 | (ushort)(sVar74 >= sVar137) * sVar74;
        bVar8 = true;
      }
      if ((((((((((((((((auVar67 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (auVar67 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar67 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar67 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar67 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar67 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar67 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar67 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar67 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar67 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar67 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar67 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar67 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar67 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar67 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar67[0xf])
      {
        *(undefined1 (*) [16])(qcoeff_ptr + lVar60 + 0xc) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(qcoeff_ptr + lVar60 + 8) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(qcoeff_ptr + lVar60 + 4) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(qcoeff_ptr + lVar60) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(dqcoeff_ptr + lVar60 + 0xc) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(dqcoeff_ptr + lVar60 + 8) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(dqcoeff_ptr + lVar60 + 4) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(dqcoeff_ptr + lVar60) = (undefined1  [16])0x0;
      }
      else {
        auVar75 = psraw(auVar124,0xf);
        auVar201 = psraw(auVar144,0xf);
        auVar67 = paddsw(auVar99,local_38);
        auVar124 = pmulhw(auVar67,local_48);
        auVar203._0_2_ = auVar124._0_2_ + auVar67._0_2_;
        auVar203._2_2_ = auVar124._2_2_ + auVar67._2_2_;
        auVar203._4_2_ = auVar124._4_2_ + auVar67._4_2_;
        auVar203._6_2_ = auVar124._6_2_ + auVar67._6_2_;
        auVar203._8_2_ = auVar124._8_2_ + auVar67._8_2_;
        auVar203._10_2_ = auVar124._10_2_ + auVar67._10_2_;
        auVar203._12_2_ = auVar124._12_2_ + auVar67._12_2_;
        auVar203._14_2_ = auVar124._14_2_ + auVar67._14_2_;
        auVar67 = pmulhw(auVar203,local_58);
        auVar100._0_2_ = (ushort)(auVar203._0_2_ * local_58._0_2_) >> 0xe;
        auVar100._2_2_ = (ushort)(auVar203._2_2_ * local_58._2_2_) >> 0xe;
        auVar100._4_2_ = (ushort)(auVar203._4_2_ * local_58._4_2_) >> 0xe;
        auVar100._6_2_ = (ushort)(auVar203._6_2_ * local_58._6_2_) >> 0xe;
        auVar100._8_2_ = (ushort)(auVar203._8_2_ * local_58._8_2_) >> 0xe;
        auVar100._10_2_ = (ushort)(auVar203._10_2_ * local_58._10_2_) >> 0xe;
        auVar100._12_2_ = (ushort)(auVar203._12_2_ * local_58._12_2_) >> 0xe;
        auVar100._14_2_ = (ushort)(auVar203._14_2_ * local_58._14_2_) >> 0xe;
        auVar144 = psllw(auVar67,2);
        auVar124 = paddsw(auVar193,local_38);
        auVar67 = pmulhw(auVar124,local_48);
        auVar101._0_2_ = auVar67._0_2_ + auVar124._0_2_;
        auVar101._2_2_ = auVar67._2_2_ + auVar124._2_2_;
        auVar101._4_2_ = auVar67._4_2_ + auVar124._4_2_;
        auVar101._6_2_ = auVar67._6_2_ + auVar124._6_2_;
        auVar101._8_2_ = auVar67._8_2_ + auVar124._8_2_;
        auVar101._10_2_ = auVar67._10_2_ + auVar124._10_2_;
        auVar101._12_2_ = auVar67._12_2_ + auVar124._12_2_;
        auVar101._14_2_ = auVar67._14_2_ + auVar124._14_2_;
        auVar67 = pmulhw(auVar101,local_58);
        auVar194._0_2_ = (ushort)(auVar101._0_2_ * local_58._0_2_) >> 0xe;
        auVar194._2_2_ = (ushort)(auVar101._2_2_ * local_58._2_2_) >> 0xe;
        auVar194._4_2_ = (ushort)(auVar101._4_2_ * local_58._4_2_) >> 0xe;
        auVar194._6_2_ = (ushort)(auVar101._6_2_ * local_58._6_2_) >> 0xe;
        auVar194._8_2_ = (ushort)(auVar101._8_2_ * local_58._8_2_) >> 0xe;
        auVar194._10_2_ = (ushort)(auVar101._10_2_ * local_58._10_2_) >> 0xe;
        auVar194._12_2_ = (ushort)(auVar101._12_2_ * local_58._12_2_) >> 0xe;
        auVar194._14_2_ = (ushort)(auVar101._14_2_ * local_58._14_2_) >> 0xe;
        auVar67 = psllw(auVar67,2);
        auVar124 = (auVar144 | auVar100) ^ auVar75;
        auVar204._0_2_ = auVar124._0_2_ - auVar75._0_2_;
        auVar204._2_2_ = auVar124._2_2_ - auVar75._2_2_;
        auVar204._4_2_ = auVar124._4_2_ - auVar75._4_2_;
        auVar204._6_2_ = auVar124._6_2_ - auVar75._6_2_;
        auVar204._8_2_ = auVar124._8_2_ - auVar75._8_2_;
        auVar204._10_2_ = auVar124._10_2_ - auVar75._10_2_;
        auVar204._12_2_ = auVar124._12_2_ - auVar75._12_2_;
        auVar204._14_2_ = auVar124._14_2_ - auVar75._14_2_;
        auVar67 = (auVar67 | auVar194) ^ auVar201;
        auVar102._0_2_ = auVar67._0_2_ - auVar201._0_2_;
        auVar102._2_2_ = auVar67._2_2_ - auVar201._2_2_;
        auVar102._4_2_ = auVar67._4_2_ - auVar201._4_2_;
        auVar102._6_2_ = auVar67._6_2_ - auVar201._6_2_;
        auVar102._8_2_ = auVar67._8_2_ - auVar201._8_2_;
        auVar102._10_2_ = auVar67._10_2_ - auVar201._10_2_;
        auVar102._12_2_ = auVar67._12_2_ - auVar201._12_2_;
        auVar102._14_2_ = auVar67._14_2_ - auVar201._14_2_;
        auVar83 = auVar83 & auVar204;
        auVar185 = auVar185 & auVar102;
        auVar67 = psraw(auVar83,0xf);
        sVar116 = auVar83._6_2_;
        auVar106._0_12_ = auVar83._0_12_;
        auVar106._12_2_ = sVar116;
        auVar106._14_2_ = auVar67._6_2_;
        auVar105._12_4_ = auVar106._12_4_;
        auVar105._0_10_ = auVar83._0_10_;
        auVar105._10_2_ = auVar67._4_2_;
        sVar88 = auVar83._4_2_;
        auVar104._10_6_ = auVar105._10_6_;
        auVar104._0_8_ = auVar83._0_8_;
        auVar104._8_2_ = sVar88;
        auVar103._8_8_ = auVar104._8_8_;
        auVar103._6_2_ = auVar67._2_2_;
        sVar86 = auVar83._2_2_;
        auVar103._4_2_ = sVar86;
        auVar103._0_2_ = auVar83._0_2_;
        auVar103._2_2_ = auVar67._0_2_;
        sVar120 = auVar83._8_2_;
        sVar121 = auVar83._10_2_;
        uVar178 = auVar67._10_2_;
        sVar122 = auVar83._12_2_;
        uVar179 = auVar67._12_2_;
        sVar123 = auVar83._14_2_;
        uVar180 = auVar67._14_2_;
        *(undefined1 (*) [16])(qcoeff_ptr + lVar60) = auVar103;
        ptVar2 = qcoeff_ptr + lVar60 + 4;
        *(short *)ptVar2 = sVar120;
        *(ushort *)((long)ptVar2 + 2) = auVar67._8_2_;
        *(short *)(ptVar2 + 1) = sVar121;
        *(ushort *)((long)ptVar2 + 6) = uVar178;
        *(short *)(ptVar2 + 2) = sVar122;
        *(ushort *)((long)ptVar2 + 10) = uVar179;
        *(short *)(ptVar2 + 3) = sVar123;
        *(ushort *)((long)ptVar2 + 0xe) = uVar180;
        auVar75 = psraw(auVar185,0xf);
        sVar118 = auVar185._6_2_;
        auVar110._0_12_ = auVar185._0_12_;
        auVar110._12_2_ = sVar118;
        auVar110._14_2_ = auVar75._6_2_;
        auVar109._12_4_ = auVar110._12_4_;
        auVar109._0_10_ = auVar185._0_10_;
        auVar109._10_2_ = auVar75._4_2_;
        sVar114 = auVar185._4_2_;
        auVar108._10_6_ = auVar109._10_6_;
        auVar108._0_8_ = auVar185._0_8_;
        auVar108._8_2_ = sVar114;
        auVar107._8_8_ = auVar108._8_8_;
        auVar107._6_2_ = auVar75._2_2_;
        sVar87 = auVar185._2_2_;
        auVar107._4_2_ = sVar87;
        auVar107._0_2_ = auVar185._0_2_;
        auVar107._2_2_ = auVar75._0_2_;
        sVar138 = auVar185._8_2_;
        sVar139 = auVar185._10_2_;
        uVar199 = auVar75._10_2_;
        sVar140 = auVar185._12_2_;
        uVar200 = auVar75._12_2_;
        sVar142 = auVar185._14_2_;
        uVar172 = auVar75._14_2_;
        *(undefined1 (*) [16])(qcoeff_ptr + lVar60 + 8) = auVar107;
        ptVar2 = qcoeff_ptr + lVar60 + 0xc;
        *(short *)ptVar2 = sVar138;
        *(ushort *)((long)ptVar2 + 2) = auVar75._8_2_;
        *(short *)(ptVar2 + 1) = sVar139;
        *(ushort *)((long)ptVar2 + 6) = uVar199;
        *(short *)(ptVar2 + 2) = sVar140;
        *(ushort *)((long)ptVar2 + 10) = uVar200;
        *(short *)(ptVar2 + 3) = sVar142;
        *(ushort *)((long)ptVar2 + 0xe) = uVar172;
        sVar137 = -auVar103._0_2_;
        sVar69 = -sVar86;
        sVar74 = -sVar88;
        sVar141 = -sVar116;
        sVar3 = -sVar120;
        sVar4 = -sVar121;
        sVar5 = -sVar122;
        sVar6 = -sVar123;
        auVar111._0_2_ =
             (ushort)(sVar137 < auVar103._0_2_) * auVar103._0_2_ |
             (ushort)(sVar137 >= auVar103._0_2_) * sVar137;
        auVar111._2_2_ = (ushort)(sVar69 < sVar86) * sVar86 | (ushort)(sVar69 >= sVar86) * sVar69;
        auVar111._4_2_ = (ushort)(sVar74 < sVar88) * sVar88 | (ushort)(sVar74 >= sVar88) * sVar74;
        auVar111._6_2_ =
             (ushort)(sVar141 < sVar116) * sVar116 | (ushort)(sVar141 >= sVar116) * sVar141;
        auVar111._8_2_ = (ushort)(sVar3 < sVar120) * sVar120 | (ushort)(sVar3 >= sVar120) * sVar3;
        auVar111._10_2_ = (ushort)(sVar4 < sVar121) * sVar121 | (ushort)(sVar4 >= sVar121) * sVar4;
        auVar111._12_2_ = (ushort)(sVar5 < sVar122) * sVar122 | (ushort)(sVar5 >= sVar122) * sVar5;
        auVar111._14_2_ = (ushort)(sVar6 < sVar123) * sVar123 | (ushort)(sVar6 >= sVar123) * sVar6;
        auVar12._10_2_ = 0;
        auVar12._0_10_ = auVar67._0_10_;
        auVar12._12_2_ = auVar67._6_2_;
        auVar20._8_2_ = auVar67._4_2_;
        auVar20._0_8_ = auVar67._0_8_;
        auVar20._10_4_ = auVar12._10_4_;
        auVar54._6_8_ = 0;
        auVar54._0_6_ = auVar20._8_6_;
        Var48 = CONCAT82(SUB148(auVar54 << 0x40,6),auVar67._2_2_);
        auVar84._0_4_ = CONCAT22(0,auVar67._0_2_);
        auVar84._4_10_ = Var48;
        auVar84._14_2_ = 0;
        auVar175._0_4_ = CONCAT22(0,auVar67._8_2_);
        auVar175._4_2_ = uVar178;
        auVar175._6_2_ = 0;
        auVar175._8_2_ = uVar179;
        auVar175._10_2_ = 0;
        auVar175._12_2_ = uVar180;
        auVar175._14_2_ = 0;
        sVar137 = auVar111._6_2_ * local_68._6_2_;
        auVar67 = pmulhw(auVar111,local_68);
        uVar61 = CONCAT22(auVar67._6_2_,sVar137);
        Var58 = CONCAT64(CONCAT42(uVar61,auVar67._4_2_),
                         CONCAT22(auVar111._4_2_ * local_68._4_2_,sVar137));
        auVar55._4_8_ = (long)((unkuint10)Var58 >> 0x10);
        auVar55._2_2_ = auVar67._2_2_;
        auVar55._0_2_ = auVar111._2_2_ * local_68._2_2_;
        uVar132 = CONCAT22(auVar67._8_2_,auVar111._8_2_ * local_68._8_2_);
        auVar192._0_8_ =
             CONCAT26(auVar67._10_2_,CONCAT24(auVar111._10_2_ * local_68._10_2_,uVar132));
        auVar192._8_2_ = auVar111._12_2_ * local_68._12_2_;
        auVar192._10_2_ = auVar67._12_2_;
        auVar195._12_2_ = auVar111._14_2_ * local_68._14_2_;
        auVar195._0_12_ = auVar192;
        auVar195._14_2_ = auVar67._14_2_;
        auVar205._0_4_ = CONCAT22(auVar67._0_2_,auVar111._0_2_ * local_68._0_2_) >> 2;
        auVar205._4_4_ = auVar55._0_4_ >> 2;
        auVar205._8_4_ = (uint)((unkuint10)Var58 >> 0x10) >> 2;
        auVar205._12_4_ = uVar61 >> 2;
        auVar196._0_4_ = uVar132 >> 2;
        auVar196._4_4_ = (uint)((ulong)auVar192._0_8_ >> 0x22);
        auVar196._8_4_ = auVar192._8_4_ >> 2;
        auVar196._12_4_ = auVar195._12_4_ >> 2;
        auVar205 = auVar205 ^ auVar84;
        auVar196 = auVar196 ^ auVar175;
        piVar1 = dqcoeff_ptr + lVar60;
        *piVar1 = auVar205._0_4_ - auVar84._0_4_;
        piVar1[1] = auVar205._4_4_ - (int)Var48;
        piVar1[2] = auVar205._8_4_ - auVar20._8_4_;
        piVar1[3] = auVar205._12_4_ - (auVar12._10_4_ >> 0x10);
        piVar1 = dqcoeff_ptr + lVar60 + 4;
        *piVar1 = auVar196._0_4_ - auVar175._0_4_;
        piVar1[1] = auVar196._4_4_ - (uint)uVar178;
        piVar1[2] = auVar196._8_4_ - (uint)uVar179;
        piVar1[3] = auVar196._12_4_ - (uint)uVar180;
        sVar137 = -auVar107._0_2_;
        sVar69 = -sVar87;
        sVar74 = -sVar114;
        sVar141 = -sVar118;
        sVar3 = -sVar138;
        sVar4 = -sVar139;
        sVar5 = -sVar140;
        sVar6 = -sVar142;
        auVar85._0_2_ =
             (ushort)(sVar137 < auVar107._0_2_) * auVar107._0_2_ |
             (ushort)(sVar137 >= auVar107._0_2_) * sVar137;
        auVar85._2_2_ = (ushort)(sVar69 < sVar87) * sVar87 | (ushort)(sVar69 >= sVar87) * sVar69;
        auVar85._4_2_ = (ushort)(sVar74 < sVar114) * sVar114 | (ushort)(sVar74 >= sVar114) * sVar74;
        auVar85._6_2_ =
             (ushort)(sVar141 < sVar118) * sVar118 | (ushort)(sVar141 >= sVar118) * sVar141;
        auVar85._8_2_ = (ushort)(sVar3 < sVar138) * sVar138 | (ushort)(sVar3 >= sVar138) * sVar3;
        auVar85._10_2_ = (ushort)(sVar4 < sVar139) * sVar139 | (ushort)(sVar4 >= sVar139) * sVar4;
        auVar85._12_2_ = (ushort)(sVar5 < sVar140) * sVar140 | (ushort)(sVar5 >= sVar140) * sVar5;
        auVar85._14_2_ = (ushort)(sVar6 < sVar142) * sVar142 | (ushort)(sVar6 >= sVar142) * sVar6;
        auVar13._10_2_ = 0;
        auVar13._0_10_ = auVar75._0_10_;
        auVar13._12_2_ = auVar75._6_2_;
        auVar21._8_2_ = auVar75._4_2_;
        auVar21._0_8_ = auVar75._0_8_;
        auVar21._10_4_ = auVar13._10_4_;
        auVar56._6_8_ = 0;
        auVar56._0_6_ = auVar21._8_6_;
        auVar28._4_2_ = auVar75._2_2_;
        auVar28._0_4_ = auVar75._0_4_;
        auVar28._6_8_ = SUB148(auVar56 << 0x40,6);
        auVar112._0_4_ = auVar75._0_4_ & 0xffff;
        auVar112._4_10_ = auVar28._4_10_;
        auVar112._14_2_ = 0;
        auVar171._0_4_ = CONCAT22(0,auVar75._8_2_);
        auVar171._4_2_ = uVar199;
        auVar171._6_2_ = 0;
        auVar171._8_2_ = uVar200;
        auVar171._10_2_ = 0;
        auVar171._12_2_ = uVar172;
        auVar171._14_2_ = 0;
        sVar137 = auVar85._6_2_ * local_68._6_2_;
        auVar67 = pmulhw(auVar85,local_68);
        uVar61 = CONCAT22(auVar67._6_2_,sVar137);
        Var48 = CONCAT64(CONCAT42(uVar61,auVar67._4_2_),
                         CONCAT22(auVar85._4_2_ * local_68._4_2_,sVar137));
        auVar57._4_8_ = (long)((unkuint10)Var48 >> 0x10);
        auVar57._2_2_ = auVar67._2_2_;
        auVar57._0_2_ = auVar85._2_2_ * local_68._2_2_;
        uVar132 = CONCAT22(auVar67._8_2_,auVar85._8_2_ * local_68._8_2_);
        auVar173._0_8_ = CONCAT26(auVar67._10_2_,CONCAT24(auVar85._10_2_ * local_68._10_2_,uVar132))
        ;
        auVar173._8_2_ = auVar85._12_2_ * local_68._12_2_;
        auVar173._10_2_ = auVar67._12_2_;
        auVar176._12_2_ = auVar85._14_2_ * local_68._14_2_;
        auVar176._0_12_ = auVar173;
        auVar176._14_2_ = auVar67._14_2_;
        auVar186._0_4_ = CONCAT22(auVar67._0_2_,auVar85._0_2_ * local_68._0_2_) >> 2;
        auVar186._4_4_ = auVar57._0_4_ >> 2;
        auVar186._8_4_ = (uint)((unkuint10)Var48 >> 0x10) >> 2;
        auVar186._12_4_ = uVar61 >> 2;
        auVar177._0_4_ = uVar132 >> 2;
        auVar177._4_4_ = (uint)((ulong)auVar173._0_8_ >> 0x22);
        auVar177._8_4_ = auVar173._8_4_ >> 2;
        auVar177._12_4_ = auVar176._12_4_ >> 2;
        auVar186 = auVar186 ^ auVar112;
        auVar177 = auVar177 ^ auVar171;
        piVar1 = dqcoeff_ptr + lVar60 + 8;
        *piVar1 = auVar186._0_4_ - auVar112._0_4_;
        piVar1[1] = auVar186._4_4_ - auVar28._4_4_;
        piVar1[2] = auVar186._8_4_ - auVar21._8_4_;
        piVar1[3] = auVar186._12_4_ - (auVar13._10_4_ >> 0x10);
        piVar1 = dqcoeff_ptr + lVar60 + 0xc;
        *piVar1 = auVar177._0_4_ - auVar171._0_4_;
        piVar1[1] = auVar177._4_4_ - (uint)uVar199;
        piVar1[2] = auVar177._8_4_ - (uint)uVar200;
        piVar1[3] = auVar177._12_4_ - (uint)uVar172;
      }
      uVar143 = ((short)uVar143 < (short)uVar190) * uVar190 |
                ((short)uVar143 >= (short)uVar190) * uVar143;
      uVar146 = ((short)uVar146 < (short)uVar160) * uVar160 |
                ((short)uVar146 >= (short)uVar160) * uVar146;
      uVar147 = ((short)uVar147 < (short)uVar161) * uVar161 |
                ((short)uVar147 >= (short)uVar161) * uVar147;
      uVar148 = ((short)uVar148 < (short)uVar162) * uVar162 |
                ((short)uVar148 >= (short)uVar162) * uVar148;
      uVar149 = ((short)uVar149 < (short)uVar163) * uVar163 |
                ((short)uVar149 >= (short)uVar163) * uVar149;
      uVar150 = ((short)uVar150 < (short)uVar164) * uVar164 |
                ((short)uVar150 >= (short)uVar164) * uVar150;
      uVar151 = ((short)uVar151 < (short)uVar165) * uVar165 |
                ((short)uVar151 >= (short)uVar165) * uVar151;
      uVar152 = ((short)uVar152 < (short)uVar166) * uVar166 |
                ((short)uVar152 >= (short)uVar166) * uVar152;
      uVar113 = ((short)uVar113 < (short)uVar131) * uVar131 |
                ((short)uVar113 >= (short)uVar131) * uVar113;
      uVar115 = ((short)uVar115 < (short)uVar181) * uVar181 |
                ((short)uVar115 >= (short)uVar181) * uVar115;
      uVar130 = ((short)uVar130 < (short)uVar187) * uVar187 |
                ((short)uVar130 >= (short)uVar187) * uVar130;
      uVar89 = ((short)uVar89 < (short)uVar188) * uVar188 |
               ((short)uVar89 >= (short)uVar188) * uVar89;
      uVar129 = ((short)uVar129 < (short)uVar189) * uVar189 |
                ((short)uVar129 >= (short)uVar189) * uVar129;
      uVar128 = ((short)uVar128 < (short)uVar191) * uVar191 |
                ((short)uVar128 >= (short)uVar191) * uVar128;
      uVar119 = ((short)uVar119 < (short)uVar197) * uVar197 |
                ((short)uVar119 >= (short)uVar197) * uVar119;
      uVar117 = ((short)uVar117 < (short)uVar198) * uVar198 |
                ((short)uVar117 >= (short)uVar198) * uVar117;
      lVar60 = lVar60 + 0x10;
    } while (lVar60 < n_coeffs);
  }
  if (bVar65) {
    uVar143 = ((short)uVar149 < (short)uVar143) * uVar143 |
              ((short)uVar149 >= (short)uVar143) * uVar149;
    uVar146 = ((short)uVar150 < (short)uVar146) * uVar146 |
              ((short)uVar150 >= (short)uVar146) * uVar150;
    uVar151 = ((short)uVar151 < (short)uVar147) * uVar147 |
              ((short)uVar151 >= (short)uVar147) * uVar151;
    uVar152 = ((short)uVar152 < (short)uVar148) * uVar148 |
              ((short)uVar152 >= (short)uVar148) * uVar152;
    uVar143 = ((short)uVar151 < (short)uVar143) * uVar143 |
              ((short)uVar151 >= (short)uVar143) * uVar151;
    uVar146 = ((short)uVar152 < (short)uVar146) * uVar146 |
              ((short)uVar152 >= (short)uVar146) * uVar152;
    uVar61 = (ushort)(((short)uVar146 < (short)uVar143) * uVar143 |
                     ((short)uVar146 >= (short)uVar143) * uVar146) + 1;
  }
  else {
    uVar61 = 0;
  }
  if (bVar8) {
    uVar146 = ((short)uVar129 < (short)uVar113) * uVar113 |
              ((short)uVar129 >= (short)uVar113) * uVar129;
    uVar143 = ((short)uVar128 < (short)uVar115) * uVar115 |
              ((short)uVar128 >= (short)uVar115) * uVar128;
    uVar152 = ((short)uVar119 < (short)uVar130) * uVar130 |
              ((short)uVar119 >= (short)uVar130) * uVar119;
    uVar151 = ((short)uVar117 < (short)uVar89) * uVar89 |
              ((short)uVar117 >= (short)uVar89) * uVar117;
    uVar146 = ((short)uVar152 < (short)uVar146) * uVar146 |
              ((short)uVar152 >= (short)uVar146) * uVar152;
    uVar143 = ((short)uVar151 < (short)uVar143) * uVar143 |
              ((short)uVar151 >= (short)uVar143) * uVar151;
    uVar132 = (uint)(ushort)(((short)uVar143 < (short)uVar146) * uVar146 |
                            ((short)uVar143 >= (short)uVar146) * uVar143);
  }
  else {
    uVar132 = 0xffffffff;
  }
  if ((int)uVar61 <= (int)uVar132) {
    iVar66 = uVar132 + 1;
    psVar63 = scan + uVar132;
    do {
      sVar137 = *psVar63;
      qcoeff_ptr[sVar137] = 0;
      dqcoeff_ptr[sVar137] = 0;
      iVar66 = iVar66 + -1;
      psVar63 = psVar63 + -1;
    } while ((int)uVar61 < iVar66);
  }
  uVar64 = 0xffffffff;
  uVar59 = (ulong)uVar61;
  do {
    iVar66 = (int)uVar64;
    if ((long)uVar59 < 1) break;
    lVar60 = uVar59 - 1;
    uVar59 = uVar59 - 1;
    if (qcoeff_ptr[scan[lVar60]] != 0) {
      uVar64 = uVar59 & 0xffffffff;
    }
    iVar66 = (int)uVar64;
  } while (qcoeff_ptr[scan[lVar60]] == 0);
  uVar62 = (uint16_t)(iVar66 + 1U);
  *eob_ptr = uVar62;
  if (uVar61 == 0) {
    uVar132 = 0xffffffff;
  }
  else {
    lVar60 = 0;
    do {
      uVar132 = (uint)lVar60;
      if (qcoeff_ptr[scan[lVar60]] != 0) break;
      bVar65 = (ulong)uVar61 - 1 != lVar60;
      lVar60 = lVar60 + 1;
      uVar132 = 0xffffffff;
    } while (bVar65);
  }
  if ((uVar62 != 0) && (uVar61 = (iVar66 + 1U & 0xffff) - 1, uVar132 == uVar61)) {
    sVar137 = scan[uVar61];
    if (((qcoeff_ptr[sVar137] == 1) || (qcoeff_ptr[sVar137] == -1)) &&
       (uVar61 = coeff_ptr[sVar137] >> 0x1f,
       (int)((coeff_ptr[sVar137] << 5 ^ uVar61) - uVar61) <
       *(int *)(local_68 + (ulong)(sVar137 != 0) * 4 + -8) * 0x20 +
       (dequant_ptr[sVar137 != 0] * 0x20d + 0x40 >> 7))) {
      qcoeff_ptr[sVar137] = 0;
      dqcoeff_ptr[sVar137] = 0;
      *eob_ptr = 0;
    }
  }
  return;
}

Assistant:

void aom_quantize_b_64x64_adaptive_sse2(
    const tran_low_t *coeff_ptr, intptr_t n_coeffs, const int16_t *zbin_ptr,
    const int16_t *round_ptr, const int16_t *quant_ptr,
    const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
    tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr, uint16_t *eob_ptr,
    const int16_t *scan, const int16_t *iscan) {
  int index = 16;
  const int log_scale = 2;
  int non_zero_count = 0;
  int non_zero_count_prescan_add_zero = 0;
  int is_found0 = 0, is_found1 = 0;
  int eob = -1;
  const __m128i zero = _mm_setzero_si128();
  const __m128i one = _mm_set1_epi16(1);
  const __m128i log_scale_vec = _mm_set1_epi16(log_scale);
  __m128i zbin, round, quant, dequant, shift;
  __m128i coeff0, coeff1, coeff0_sign, coeff1_sign;
  __m128i qcoeff0, qcoeff1;
  __m128i cmp_mask0, cmp_mask1;
  __m128i all_zero;
  __m128i mask0 = zero, mask1 = zero;

  const int zbins[2] = { ROUND_POWER_OF_TWO(zbin_ptr[0], log_scale),
                         ROUND_POWER_OF_TWO(zbin_ptr[1], log_scale) };
  int prescan_add[2];
  int thresh[4];
  const qm_val_t wt = (1 << AOM_QM_BITS);
  for (int i = 0; i < 2; ++i) {
    prescan_add[i] = ROUND_POWER_OF_TWO(dequant_ptr[i] * EOB_FACTOR, 7);
    thresh[i] = (zbins[i] * wt + prescan_add[i]) - 1;
  }
  thresh[2] = thresh[3] = thresh[1];
  __m128i threshold[2];
  threshold[0] = _mm_loadu_si128((__m128i *)&thresh[0]);
  threshold[1] = _mm_unpackhi_epi64(threshold[0], threshold[0]);

#if SKIP_EOB_FACTOR_ADJUST
  int first = -1;
#endif
  // Setup global values.
  zbin = _mm_load_si128((const __m128i *)zbin_ptr);
  round = _mm_load_si128((const __m128i *)round_ptr);
  quant = _mm_load_si128((const __m128i *)quant_ptr);
  dequant = _mm_load_si128((const __m128i *)dequant_ptr);
  shift = _mm_load_si128((const __m128i *)quant_shift_ptr);

  // Shift with rounding.
  zbin = _mm_add_epi16(zbin, log_scale_vec);
  round = _mm_add_epi16(round, log_scale_vec);
  zbin = _mm_srli_epi16(zbin, log_scale);
  round = _mm_srli_epi16(round, log_scale);
  zbin = _mm_sub_epi16(zbin, one);

  // Do DC and first 15 AC.
  coeff0 = load_coefficients(coeff_ptr);
  coeff1 = load_coefficients(coeff_ptr + 8);

  coeff0_sign = _mm_srai_epi16(coeff0, 15);
  coeff1_sign = _mm_srai_epi16(coeff1, 15);
  qcoeff0 = invert_sign_sse2(coeff0, coeff0_sign);
  qcoeff1 = invert_sign_sse2(coeff1, coeff1_sign);

  update_mask0(&qcoeff0, &qcoeff1, threshold, iscan, &is_found0, &mask0);

  cmp_mask0 = _mm_cmpgt_epi16(qcoeff0, zbin);
  zbin = _mm_unpackhi_epi64(zbin, zbin);  // Switch DC to AC
  cmp_mask1 = _mm_cmpgt_epi16(qcoeff1, zbin);

  update_mask1(&cmp_mask0, &cmp_mask1, iscan, &is_found1, &mask1);

  threshold[0] = threshold[1];
  all_zero = _mm_or_si128(cmp_mask0, cmp_mask1);
  if (_mm_movemask_epi8(all_zero) == 0) {
    _mm_store_si128((__m128i *)(qcoeff_ptr), zero);
    _mm_store_si128((__m128i *)(qcoeff_ptr + 4), zero);
    _mm_store_si128((__m128i *)(qcoeff_ptr + 8), zero);
    _mm_store_si128((__m128i *)(qcoeff_ptr + 12), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr + 4), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr + 8), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr + 12), zero);
    round = _mm_unpackhi_epi64(round, round);
    quant = _mm_unpackhi_epi64(quant, quant);
    shift = _mm_unpackhi_epi64(shift, shift);
    dequant = _mm_unpackhi_epi64(dequant, dequant);
  } else {
    calculate_qcoeff_log_scale(&qcoeff0, round, quant, &shift, &log_scale);
    round = _mm_unpackhi_epi64(round, round);
    quant = _mm_unpackhi_epi64(quant, quant);
    shift = _mm_unpackhi_epi64(shift, shift);
    calculate_qcoeff_log_scale(&qcoeff1, round, quant, &shift, &log_scale);

    // Reinsert signs
    qcoeff0 = invert_sign_sse2(qcoeff0, coeff0_sign);
    qcoeff1 = invert_sign_sse2(qcoeff1, coeff1_sign);

    // Mask out zbin threshold coeffs
    qcoeff0 = _mm_and_si128(qcoeff0, cmp_mask0);
    qcoeff1 = _mm_and_si128(qcoeff1, cmp_mask1);

    store_coefficients(qcoeff0, qcoeff_ptr);
    store_coefficients(qcoeff1, qcoeff_ptr + 8);

    calculate_dqcoeff_and_store_log_scale(qcoeff0, dequant, zero, dqcoeff_ptr,
                                          &log_scale);
    dequant = _mm_unpackhi_epi64(dequant, dequant);
    calculate_dqcoeff_and_store_log_scale(qcoeff1, dequant, zero,
                                          dqcoeff_ptr + 8, &log_scale);
  }

  // AC only loop.
  while (index < n_coeffs) {
    coeff0 = load_coefficients(coeff_ptr + index);
    coeff1 = load_coefficients(coeff_ptr + index + 8);

    coeff0_sign = _mm_srai_epi16(coeff0, 15);
    coeff1_sign = _mm_srai_epi16(coeff1, 15);
    qcoeff0 = invert_sign_sse2(coeff0, coeff0_sign);
    qcoeff1 = invert_sign_sse2(coeff1, coeff1_sign);

    update_mask0(&qcoeff0, &qcoeff1, threshold, iscan + index, &is_found0,
                 &mask0);

    cmp_mask0 = _mm_cmpgt_epi16(qcoeff0, zbin);
    cmp_mask1 = _mm_cmpgt_epi16(qcoeff1, zbin);

    update_mask1(&cmp_mask0, &cmp_mask1, iscan + index, &is_found1, &mask1);

    all_zero = _mm_or_si128(cmp_mask0, cmp_mask1);
    if (_mm_movemask_epi8(all_zero) == 0) {
      _mm_store_si128((__m128i *)(qcoeff_ptr + index), zero);
      _mm_store_si128((__m128i *)(qcoeff_ptr + index + 4), zero);
      _mm_store_si128((__m128i *)(qcoeff_ptr + index + 8), zero);
      _mm_store_si128((__m128i *)(qcoeff_ptr + index + 12), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index + 4), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index + 8), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index + 12), zero);
      index += 16;
      continue;
    }
    calculate_qcoeff_log_scale(&qcoeff0, round, quant, &shift, &log_scale);
    calculate_qcoeff_log_scale(&qcoeff1, round, quant, &shift, &log_scale);

    qcoeff0 = invert_sign_sse2(qcoeff0, coeff0_sign);
    qcoeff1 = invert_sign_sse2(qcoeff1, coeff1_sign);

    qcoeff0 = _mm_and_si128(qcoeff0, cmp_mask0);
    qcoeff1 = _mm_and_si128(qcoeff1, cmp_mask1);

    store_coefficients(qcoeff0, qcoeff_ptr + index);
    store_coefficients(qcoeff1, qcoeff_ptr + index + 8);

    calculate_dqcoeff_and_store_log_scale(qcoeff0, dequant, zero,
                                          dqcoeff_ptr + index, &log_scale);
    calculate_dqcoeff_and_store_log_scale(qcoeff1, dequant, zero,
                                          dqcoeff_ptr + index + 8, &log_scale);
    index += 16;
  }
  if (is_found0) non_zero_count = calculate_non_zero_count(mask0);
  if (is_found1)
    non_zero_count_prescan_add_zero = calculate_non_zero_count(mask1);

  for (int i = non_zero_count_prescan_add_zero - 1; i >= non_zero_count; i--) {
    const int rc = scan[i];
    qcoeff_ptr[rc] = 0;
    dqcoeff_ptr[rc] = 0;
  }

  for (int i = non_zero_count - 1; i >= 0; i--) {
    const int rc = scan[i];
    if (qcoeff_ptr[rc]) {
      eob = i;
      break;
    }
  }

  *eob_ptr = eob + 1;
#if SKIP_EOB_FACTOR_ADJUST
  // TODO(Aniket): Experiment the following loop with intrinsic by combining
  // with the quantization loop above
  for (int i = 0; i < non_zero_count; i++) {
    const int rc = scan[i];
    const int qcoeff = qcoeff_ptr[rc];
    if (qcoeff) {
      first = i;
      break;
    }
  }
  if ((*eob_ptr - 1) >= 0 && first == (*eob_ptr - 1)) {
    const int rc = scan[(*eob_ptr - 1)];
    if (qcoeff_ptr[rc] == 1 || qcoeff_ptr[rc] == -1) {
      const int coeff = coeff_ptr[rc] * wt;
      const int coeff_sign = AOMSIGN(coeff);
      const int abs_coeff = (coeff ^ coeff_sign) - coeff_sign;
      const int factor = EOB_FACTOR + SKIP_EOB_FACTOR_ADJUST;
      const int prescan_add_val =
          ROUND_POWER_OF_TWO(dequant_ptr[rc != 0] * factor, 7);
      if (abs_coeff < (zbins[rc != 0] * (1 << AOM_QM_BITS) + prescan_add_val)) {
        qcoeff_ptr[rc] = 0;
        dqcoeff_ptr[rc] = 0;
        *eob_ptr = 0;
      }
    }
  }
#endif
}